

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O1

void p_crypto_hash_gost3411_finish(PHashGOST3411 *ctx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  puint i;
  long lVar5;
  
  uVar4 = ctx->len[0] >> 3 & 0x1f;
  uVar2 = 0x20 - uVar4;
  if ((uVar2 & 0x1f) != 0) {
    lVar5 = 0;
    memset((void *)((long)ctx->buf + (ulong)uVar4),0,(ulong)uVar2);
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    bVar1 = false;
    do {
      uVar2 = ctx->sum[lVar5];
      uVar4 = bVar1 + uVar2;
      uVar3 = uVar4 + ctx->buf[lVar5];
      ctx->sum[lVar5] = uVar3;
      bVar1 = uVar3 < uVar2 || CARRY4(uVar4,ctx->buf[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
  }
  pp_crypto_hash_gost3411_process(ctx,ctx->len);
  pp_crypto_hash_gost3411_process(ctx,ctx->sum);
  return;
}

Assistant:

void
p_crypto_hash_gost3411_finish (PHashGOST3411 *ctx)
{
	puint32	left;
	puint32	last;

	left = ctx->len[0] & 0xFF;
	last = 32 - (left >> 3);

	if (last % 32 != 0) {
		memset ((pchar *) ctx->buf + (left >> 3), 0, last);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);
	}

	pp_crypto_hash_gost3411_process (ctx, ctx->len);
	pp_crypto_hash_gost3411_process (ctx, ctx->sum);

	pp_crypto_hash_gost3411_swap_bytes (ctx->hash, 8);
}